

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O0

int __thiscall EnvironmentROBARM::GetStartHeuristic(EnvironmentROBARM *this,int stateID)

{
  char *what_arg;
  SBPL_Exception *in_stack_ffffffffffffffe0;
  
  what_arg = (char *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffffe0,what_arg);
  __cxa_throw(what_arg,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
}

Assistant:

int EnvironmentROBARM::GetStartHeuristic(int stateID)
{
#if USE_HEUR==0
    return 0;
#endif

#if DEBUG
    if (stateID >= (int)EnvROBARM.StateID2CoordTable.size()) {
        throw SBPL_Exception("ERROR in EnvROBARM... function: stateID illegal");
    }
#endif

    //define this function if it used in the planner (heuristic backward search would use it)

    throw SBPL_Exception("ERROR in EnvROBARM.. function: GetStartHeuristic undefined");

    return 0;
}